

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# search.c
# Opt level: O1

el_action_t cv_repeat_srch(EditLine *el,wint_t c)

{
  el_action_t eVar1;
  
  (el->el_state).lastcmd = (el_action_t)c;
  (el->el_line).lastchar = (el->el_line).buffer;
  if (c == 0x18) {
    eVar1 = ed_search_prev_history(el,0);
    return eVar1;
  }
  if (c == 0x17) {
    eVar1 = ed_search_next_history(el,0);
    return eVar1;
  }
  return '\x06';
}

Assistant:

libedit_private el_action_t
cv_repeat_srch(EditLine *el, wint_t c)
{

#ifdef SDEBUG
	static ct_buffer_t conv;
	(void) fprintf(el->el_errfile, "dir %d patlen %ld patbuf %s\n",
	    c, el->el_search.patlen, ct_encode_string(el->el_search.patbuf, &conv));
#endif

	el->el_state.lastcmd = (el_action_t) c;	/* Hack to stop c_setpat */
	el->el_line.lastchar = el->el_line.buffer;

	switch (c) {
	case ED_SEARCH_NEXT_HISTORY:
		return ed_search_next_history(el, 0);
	case ED_SEARCH_PREV_HISTORY:
		return ed_search_prev_history(el, 0);
	default:
		return CC_ERROR;
	}
}